

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::MemObjectAllocator::MemObjectAllocator
          (MemObjectAllocator *this,TestLog *log,RenderContext *renderContext,
          MemObjectType objectTypes,MemObjectConfig *config,int seed)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  size_type __n;
  allocator<unsigned_char> local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  allocator<unsigned_char> local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  int local_48;
  int dummySize;
  int local_34;
  MemObjectConfig *pMStack_30;
  int seed_local;
  MemObjectConfig *config_local;
  RenderContext *pRStack_20;
  MemObjectType objectTypes_local;
  RenderContext *renderContext_local;
  TestLog *log_local;
  MemObjectAllocator *this_local;
  
  local_34 = seed;
  pMStack_30 = config;
  config_local._4_4_ = objectTypes;
  pRStack_20 = renderContext;
  renderContext_local = (RenderContext *)log;
  log_local = (TestLog *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_buffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_textures);
  this->m_seed = local_34;
  this->m_objectCount = 0;
  this->m_bytesRequired = 0;
  this->m_objectTypes = config_local._4_4_;
  this->m_result = RESULT_LAST;
  bVar2 = pMStack_30->write;
  bVar3 = pMStack_30->use;
  uVar4 = pMStack_30->field_0x13;
  (this->m_config).useDummyData = pMStack_30->useDummyData;
  (this->m_config).write = bVar2;
  (this->m_config).use = bVar3;
  (this->m_config).field_0x13 = uVar4;
  iVar1 = pMStack_30->maxBufferSize;
  iVar5 = pMStack_30->minTextureSize;
  iVar6 = pMStack_30->maxTextureSize;
  (this->m_config).minBufferSize = pMStack_30->minBufferSize;
  (this->m_config).maxBufferSize = iVar1;
  (this->m_config).minTextureSize = iVar5;
  (this->m_config).maxTextureSize = iVar6;
  this->m_glError = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_dummyData);
  BufferRenderer::BufferRenderer(&this->m_bufferRenderer,(TestLog *)renderContext_local,pRStack_20);
  TextureRenderer::TextureRenderer
            (&this->m_textureRenderer,(TestLog *)renderContext_local,pRStack_20);
  if (((this->m_config).useDummyData & 1U) == 0) {
    if (((this->m_config).write & 1U) != 0) {
      std::allocator<unsigned_char>::allocator(&local_81);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,0x80,&local_81);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->m_dummyData,&local_80);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_80);
      std::allocator<unsigned_char>::~allocator(&local_81);
    }
  }
  else {
    iVar1 = (this->m_config).maxTextureSize;
    local_48 = ::deMax32((this->m_config).maxBufferSize,iVar1 * iVar1 * 4);
    __n = (size_type)local_48;
    std::allocator<unsigned_char>::allocator(&local_61);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_60,__n,&local_61);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->m_dummyData,&local_60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
    std::allocator<unsigned_char>::~allocator(&local_61);
  }
  return;
}

Assistant:

MemObjectAllocator::MemObjectAllocator (tcu::TestLog& log, glu::RenderContext& renderContext, MemObjectType objectTypes, const MemObjectConfig& config, int seed)
	: m_seed			(seed)
	, m_objectCount		(0)
	, m_bytesRequired	(0)
	, m_objectTypes		(objectTypes)
	, m_result			(RESULT_LAST)
	, m_config			(config)
	, m_glError			(0)
	, m_bufferRenderer	(log, renderContext)
	, m_textureRenderer	(log, renderContext)
{
	DE_UNREF(renderContext);

	if (m_config.useDummyData)
	{
		int dummySize = deMax32(m_config.maxBufferSize, m_config.maxTextureSize*m_config.maxTextureSize*4);
		m_dummyData = vector<deUint8>(dummySize);
	}
	else if (m_config.write)
		m_dummyData = vector<deUint8>(128);
}